

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
dgrminer::find_minimum_labelings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges,
          bool ignore_starting_edges)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  pointer paVar4;
  pointer piVar5;
  pointer paVar6;
  undefined7 in_register_00000009;
  pointer paVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int local_60;
  undefined4 local_5c;
  array<int,_10UL> min_edge;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,ignore_starting_edges);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar13 = 8;
  lVar12 = 0;
  uVar8 = 0;
  do {
    paVar4 = (pattern_edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pattern_edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4) / 0x28) <= uVar8)
    {
      return __return_storage_ptr__;
    }
    if ((char)local_5c == '\0') {
      paVar6 = (starting_edges->
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)(starting_edges->
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6;
      for (lVar10 = 0; lVar10 != lVar9 >> 5; lVar10 = lVar10 + 1) {
        lVar11 = 0;
        do {
          if (lVar11 == 7) goto LAB_0011a277;
          lVar1 = lVar11 * 4;
          piVar2 = paVar6->_M_elems + lVar11;
          lVar11 = lVar11 + 1;
        } while (*(int *)((long)paVar4->_M_elems + lVar1 + lVar13) == *piVar2);
        paVar6 = paVar6 + 1;
      }
    }
    else {
LAB_0011a277:
      piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = (int)uVar8;
      if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish == piVar5) {
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_60);
        paVar4 = (pattern_edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        min_edge._M_elems._32_8_ = *(undefined8 *)(paVar4[uVar8]._M_elems + 8);
        min_edge._M_elems._0_8_ = *(undefined8 *)paVar4[uVar8]._M_elems;
        min_edge._M_elems._16_8_ = *(undefined8 *)(paVar4[uVar8]._M_elems + 4);
        min_edge._M_elems._24_8_ = *(undefined8 *)(paVar4[uVar8]._M_elems + 4 + 2);
        min_edge._M_elems._8_8_ = *(undefined8 *)(paVar4[uVar8]._M_elems + 2);
      }
      else {
        paVar7 = paVar4 + uVar8;
        lVar9 = 2;
        do {
          if (lVar9 == 9) {
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,&local_60);
            break;
          }
          iVar3 = *(int *)((long)paVar4->_M_elems + lVar9 * 4 + lVar12);
          piVar2 = min_edge._M_elems + lVar9;
          if (iVar3 < *piVar2) {
            min_edge._M_elems._32_8_ = *(undefined8 *)(paVar7->_M_elems + 8);
            min_edge._M_elems._0_8_ = *(undefined8 *)paVar7->_M_elems;
            min_edge._M_elems._8_8_ = *(undefined8 *)(paVar7->_M_elems + 2);
            min_edge._M_elems._16_8_ = *(undefined8 *)(paVar7->_M_elems + 4);
            min_edge._M_elems._24_8_ = *(undefined8 *)(paVar7->_M_elems + 6);
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = piVar5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,&local_60);
            break;
          }
          lVar9 = lVar9 + 1;
        } while (iVar3 <= *piVar2);
      }
    }
    uVar8 = uVar8 + 1;
    lVar13 = lVar13 + 0x28;
    lVar12 = lVar12 + 0x28;
  } while( true );
}

Assistant:

std::vector<int> find_minimum_labelings(std::vector<std::array<int, 10>> &pattern_edge_list,
                                            std::vector<std::array<int, 8>> &starting_edges,
                                            bool ignore_starting_edges)
    {
        std::array<int, 10> min_edge;
        std::vector<int> min_ind; // can contain several indices, if there are several same edges (probably not necessary to have vector, because it may be impossible to have several of them when using edge IDs)
        for (size_t i = 0; i < pattern_edge_list.size(); i++)
        {
            // check if the i-th edge is in the starting_edges list:
            bool is_in_starting = false;

            if (ignore_starting_edges)
            {
                is_in_starting = true;
            }
            else
            {
                for (size_t j = 0; j < starting_edges.size(); j++)
                {
                    bool is_same = true;

                    // use only the first 7 elements (DO NOT USE edge id)
                    for (int k = 0; k < 7; k++)
                    {
                        if (pattern_edge_list[i][k + 2] != starting_edges[j][k])
                        {
                            is_same = false;
                            break;
                        }
                    }
                    if (is_same)
                    {
                        is_in_starting = true;
                        break;
                    }

                }
            }

            // if it is in the starting_edges list, then
            if (is_in_starting)
            {
                // if it is the first edge, add it
                if (min_ind.size() == 0)
                {
                    min_ind.push_back(i);
                    min_edge = pattern_edge_list[i];
                }
                    // if it is not the first one, check if it is smaller
                else
                {
                    // check also whether it is same as the smallest one
                    bool is_same_as_min = true;
                    // // check also edge ID (10th element)
                    // do not check ID
                    for (int k = 2; k < 9; k++)
                    {
                        if (pattern_edge_list[i][k] < min_edge[k])
                        {
                            min_edge = pattern_edge_list[i];
                            min_ind.clear();
                            min_ind.push_back(i);
                            is_same_as_min = false;
                            break;
                        }
                        else if (pattern_edge_list[i][k] > min_edge[k])
                        {
                            is_same_as_min = false;
                            break;
                        }
                    }
                    if (is_same_as_min)
                    {
                        min_ind.push_back(i);
                    }
                }
            }


        }

        return min_ind;

    }